

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O1

int64_t get_sse(AV1_COMP *cpi,MACROBLOCK *x,int64_t *sse_y)

{
  uint8_t uVar1;
  buf_2d *pbVar2;
  long lVar3;
  ulong uVar4;
  int *piVar5;
  bool bVar6;
  uint sse;
  uint local_54;
  ulong *local_50;
  MACROBLOCK *local_48;
  MB_MODE_INFO *local_40;
  AV1_COMP *local_38;
  
  uVar1 = ((cpi->common).seq_params)->monochrome;
  local_40 = *(x->e_mbd).mi;
  piVar5 = &(x->e_mbd).plane[0].subsampling_x;
  pbVar2 = &x->plane[0].src;
  lVar3 = 0;
  uVar4 = 0;
  local_50 = (ulong *)sse_y;
  local_48 = x;
  local_38 = cpi;
  do {
    if ((uVar4 != 0) && ((local_48->e_mbd).is_chroma_ref != true)) break;
    bVar6 = local_50 != (ulong *)0x0;
    (*local_38->ppi->fn_ptr[av1_ss_size_lookup[local_40->bsize][*piVar5][piVar5[1]]].vf)
              (pbVar2->buf,pbVar2->stride,((buf_2d *)(piVar5 + 3))->buf,piVar5[9],&local_54);
    if (bVar6 && uVar4 == 0) {
      *local_50 = (ulong)local_54;
    }
    lVar3 = lVar3 + (ulong)local_54;
    if (uVar1 != '\0') break;
    piVar5 = piVar5 + 0x28c;
    pbVar2 = (buf_2d *)((long)(pbVar2 + 4) + 8);
    bVar6 = uVar4 < 2;
    uVar4 = uVar4 + 1;
  } while (bVar6);
  return lVar3 << 4;
}

Assistant:

static int64_t get_sse(AV1_COMP *const cpi, BLOCK_SIZE bsize, int mi_row,
                       int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  const int mi_step = mi_size_wide[cpi->weber_bsize];
  int mb_stride = cpi->frame_info.mi_cols;
  int mb_count = 0;
  int64_t distortion = 0;

  for (int row = mi_row; row < mi_row + mi_high; row += mi_step) {
    for (int col = mi_col; col < mi_col + mi_wide; col += mi_step) {
      if (row >= cm->mi_params.mi_rows || col >= cm->mi_params.mi_cols)
        continue;

      distortion +=
          cpi->mb_weber_stats[(row / mi_step) * mb_stride + (col / mi_step)]
              .distortion;
      ++mb_count;
    }
  }

  if (mb_count) distortion = (int)(distortion / mb_count);
  distortion = AOMMAX(1, distortion);

  return (int)distortion;
}